

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O1

ktx_error_code_e ktxTexture1_IterateLevels(ktxTexture1 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktx_error_code_e kVar1;
  ktx_size_t kVar2;
  byte bVar3;
  uint uVar4;
  ktx_uint32_t level;
  uint uVar5;
  uint uVar6;
  ktx_size_t offset;
  
  kVar1 = KTX_INVALID_VALUE;
  if (iterCb != (PFNKTXITERCB)0x0 && This != (ktxTexture1 *)0x0) {
    if (This->numLevels == 0) {
      kVar1 = KTX_SUCCESS;
    }
    else {
      level = 0;
      do {
        bVar3 = (byte)level;
        uVar6 = This->baseWidth >> (bVar3 & 0x1f);
        uVar5 = This->baseHeight >> (bVar3 & 0x1f);
        uVar4 = This->baseDepth >> (bVar3 & 0x1f);
        kVar2 = ktxTexture_calcLevelSize((ktxTexture *)This,level,KTX_FORMAT_VERSION_ONE);
        (*This->vtbl->GetImageOffset)((ktxTexture *)This,level,0,0,&offset);
        kVar1 = (*iterCb)(level,0,uVar6 + (uVar6 == 0),uVar5 + (uVar5 == 0),uVar4 + (uVar4 == 0),
                          kVar2 & 0xffffffff,This->pData + offset,userdata);
        if (kVar1 != KTX_SUCCESS) {
          return kVar1;
        }
        level = level + 1;
        kVar1 = KTX_SUCCESS;
      } while (level < This->numLevels);
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture1_IterateLevels(ktxTexture1* This, PFNKTXITERCB iterCb, void* userdata)
{
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        GLsizei width, height, depth;
        ktx_uint32_t levelSize;
        ktx_size_t offset;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        levelSize = (ktx_uint32_t)ktxTexture_calcLevelSize(ktxTexture(This),
                                                       miplevel,
                                                       KTX_FORMAT_VERSION_ONE);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        ktxTexture_GetImageOffset(ktxTexture(This), miplevel, 0, 0, &offset);
        result = iterCb(miplevel, 0, width, height, depth,
                         levelSize, This->pData + offset, userdata);
        if (result != KTX_SUCCESS)
            break;
    }

    return result;
}